

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

void Lcr_ManFree(Fra_Lcr_t *p)

{
  int iVar1;
  undefined8 *puVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Fra_Lcr_t *p_local;
  
  if (p->fVerbose != 0) {
    Lcr_ManPrint(p);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_1c < iVar1; local_1c = local_1c + 1)
  {
    puVar2 = (undefined8 *)Vec_PtrEntry(p->pAig->vCis,local_1c);
    *puVar2 = 0;
  }
  Vec_PtrFree(p->vFraigs);
  if (p->pCla != (Fra_Cla_t *)0x0) {
    Fra_ClassesStop(p->pCla);
  }
  if (p->vParts != (Vec_Ptr_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vParts);
  }
  if (p->pInToOutPart != (int *)0x0) {
    free(p->pInToOutPart);
    p->pInToOutPart = (int *)0x0;
  }
  if (p->pInToOutNum != (int *)0x0) {
    free(p->pInToOutNum);
    p->pInToOutNum = (int *)0x0;
  }
  if (p != (Fra_Lcr_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Lcr_ManFree( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->fVerbose )
        Lcr_ManPrint( p );
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pNext = NULL;
    Vec_PtrFree( p->vFraigs );
    if ( p->pCla  )     Fra_ClassesStop( p->pCla );
    if ( p->vParts  )   Vec_VecFree( (Vec_Vec_t *)p->vParts );
    ABC_FREE( p->pInToOutPart );
    ABC_FREE( p->pInToOutNum );
    ABC_FREE( p );
}